

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft.c
# Opt level: O2

int fft_segment_fwd(mixed_segment *segment)

{
  undefined8 uVar1;
  uint n;
  uint uVar2;
  long lVar3;
  float *pSrc;
  long lVar4;
  undefined1 auVar5 [16];
  long lVar6;
  ulong uVar7;
  undefined4 *puVar8;
  ulong uVar9;
  ulong uVar10;
  undefined8 *puVar11;
  double dVar12;
  undefined1 auVar13 [16];
  double dVar14;
  undefined1 auVar15 [16];
  uint32_t out_samples;
  undefined8 *local_a0;
  uint32_t in_samples;
  long local_90;
  ulong local_88;
  ulong local_80;
  double local_78;
  double local_70;
  double local_68;
  double local_60;
  float *out;
  float *in;
  double local_48;
  undefined8 uStack_40;
  
  puVar11 = (undefined8 *)segment->data;
  n = *(uint *)((long)puVar11 + 0x14);
  uVar9 = (ulong)n;
  uVar2 = *(uint *)(puVar11 + 3);
  lVar3 = puVar11[5];
  pSrc = (float *)puVar11[6];
  lVar4 = puVar11[7];
  in_samples = 0xffffffff;
  mixed_buffer_request_read(&in,&in_samples,(mixed_buffer *)*puVar11);
  local_88 = (ulong)n / (ulong)uVar2;
  local_60 = (double)uVar9;
  local_90 = uVar9 - local_88;
  if (puVar11[4] == 0) {
    puVar11[4] = local_90;
  }
  local_68 = (double)*(uint *)(puVar11 + 2) / local_60;
  local_70 = ((double)local_88 * 6.283185307179586) / local_60;
  local_78 = (double)uVar2;
  local_a0 = puVar11;
  for (uVar10 = 0; uVar10 < in_samples; uVar10 = uVar10 + 1) {
    lVar6 = puVar11[4];
    *(float *)(lVar3 + lVar6 * 4) = in[uVar10];
    lVar6 = lVar6 + 1;
    puVar11[4] = lVar6;
    if ((long)uVar9 <= lVar6) {
      out_samples = n;
      local_80 = uVar10;
      mixed_buffer_clear((mixed_buffer *)puVar11[1]);
      mixed_buffer_request_write(&out,&out_samples,(mixed_buffer *)puVar11[1]);
      puVar11[4] = local_90;
      for (uVar10 = 0; uVar9 != uVar10; uVar10 = uVar10 + 1) {
        dVar12 = cos(((double)(long)uVar10 * 6.283185307179586) / local_60);
        pSrc[uVar10 * 2] = (float)((dVar12 * -0.5 + 0.5) * (double)*(float *)(lVar3 + uVar10 * 4));
        pSrc[uVar10 * 2 + 1] = 0.0;
      }
      spiral_fft_float(n,-1,pSrc,pSrc);
      for (lVar6 = 0; puVar11 = local_a0, (ulong)(n >> 1) + 1 != lVar6; lVar6 = lVar6 + 1) {
        dVar14 = (double)pSrc[lVar6 * 2];
        dVar12 = (double)pSrc[lVar6 * 2 + 1];
        auVar15._8_8_ = 0;
        auVar15._0_8_ = dVar14 * dVar14 + dVar12 * dVar12;
        auVar15 = vsqrtsd_avx(auVar15,auVar15);
        local_48 = auVar15._0_8_ + auVar15._0_8_;
        uStack_40 = 0;
        dVar14 = atan2(dVar12,dVar14);
        dVar12 = (dVar14 - (double)*(float *)(lVar4 + lVar6 * 4)) - (double)lVar6 * local_70;
        uVar7 = (ulong)(dVar12 / 3.141592653589793);
        uVar10 = uVar7 & 0xfffffffffffffffe;
        if (-1 < (long)uVar7) {
          uVar10 = ((uint)uVar7 & 1) + uVar7;
        }
        *(float *)(lVar4 + lVar6 * 4) = (float)dVar14;
        auVar5._8_8_ = uStack_40;
        auVar5._0_8_ = local_48;
        auVar13._8_8_ = 0;
        auVar13._0_8_ =
             (double)lVar6 * local_68 +
             local_68 *
             ((((double)(long)uVar10 * -3.141592653589793 + dVar12) * local_78) / 6.283185307179586)
        ;
        auVar15 = vunpcklpd_avx(auVar13,auVar5);
        auVar15 = vcvtpd2ps_avx(auVar15);
        uVar1 = vmovlpd_avx(auVar15);
        *(undefined8 *)(out + lVar6 * 2) = uVar1;
      }
      mixed_buffer_finish_write(out_samples,(mixed_buffer *)local_a0[1]);
      for (lVar6 = 0; uVar10 = local_80, lVar6 < local_90; lVar6 = lVar6 + 1) {
        puVar8 = (undefined4 *)(lVar6 * 4 + lVar3);
        *puVar8 = puVar8[local_88];
      }
    }
  }
  mixed_buffer_finish_read(in_samples,(mixed_buffer *)*puVar11);
  return 1;
}

Assistant:

VECTORIZE int fft_segment_fwd(struct mixed_segment *segment){
  struct fft_segment_data *data = (struct fft_segment_data *)segment->data;
  uint32_t framesize = data->framesize;
  uint32_t oversampling = data->oversampling;
  float *restrict in_fifo = data->fifo;
  float *restrict fft_workspace = data->fft_workspace;
  float *restrict last_phase = data->phase;

  float *restrict in, *restrict out;
  uint32_t in_samples = UINT32_MAX;
  mixed_buffer_request_read(&in, &in_samples, data->in);

  double magnitude, phase, tmp, window, real, imag;
  long i, k, qpd;
  long framesize2 = framesize/2;
  long step = framesize/oversampling;
  double bin_frequencies = (double)data->samplerate/(double)framesize;
  double expected = 2.*M_PI*(double)step/(double)framesize;
  long fifo_latency = framesize-step;
  if (data->overlap == 0) data->overlap = fifo_latency;

  for(i=0; i<in_samples; i++){
    in_fifo[data->overlap] = in[i];
    data->overlap++;
    if(data->overlap >= framesize){
      uint32_t out_samples = framesize;
      mixed_buffer_clear(data->out);
      mixed_buffer_request_write(&out, &out_samples, data->out);
      
      data->overlap = fifo_latency;

      for(k=0; k<framesize; k++){
        window = -.5*cos(2.*M_PI*(double)k/(double)framesize)+.5;
        fft_workspace[2*k] = in_fifo[k] * window;
        fft_workspace[2*k+1] = 0.;
      }

      spiral_fft_float(framesize, -1, fft_workspace, fft_workspace);

      for(k=0; k<=framesize2; k++){
        real = fft_workspace[2*k];
        imag = fft_workspace[2*k+1];
        magnitude = 2.*sqrt(real*real + imag*imag);
        phase = atan2(imag,real);
        
        tmp = phase - last_phase[k];
        last_phase[k] = phase;
        tmp -= (double)k*expected;

        qpd = tmp/M_PI;
        if (qpd >= 0) qpd += qpd&1;
        else qpd -= qpd&1;
        tmp -= M_PI*(double)qpd;

        tmp = oversampling*tmp/(2.*M_PI);
        tmp = (double)k*bin_frequencies + tmp*bin_frequencies;

        out[k*2] = tmp;
        out[k*2+1] = magnitude;
      }
      mixed_buffer_finish_write(out_samples, data->out);
      
      for (k = 0; k < fifo_latency; k++) in_fifo[k] = in_fifo[k+step];
    }
  }
  
  mixed_buffer_finish_read(in_samples, data->in);
  return 1;
}